

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O0

int state_align_search_step(ps_search_t *search,int frame_idx)

{
  acmod_t *acmod_00;
  int32 iVar1;
  int16 *senscr_00;
  int local_34;
  int i;
  int16 *senscr;
  acmod_t *acmod;
  state_align_search_t *sas;
  ps_search_t *ppStack_10;
  int frame_idx_local;
  ps_search_t *search_local;
  
  acmod_00 = search->acmod;
  sas._4_4_ = frame_idx;
  ppStack_10 = search;
  for (local_34 = 0; local_34 < *(int *)&search[1].acmod; local_34 = local_34 + 1) {
    if (*(uint *)(search[1].name + (long)local_34 * 0x58 + 0x4c) == sas._4_4_) {
      acmod_activate_hmm(acmod_00,(hmm_t *)(search[1].name + (long)local_34 * 0x58));
    }
  }
  senscr_00 = acmod_score(acmod_00,(int *)((long)&sas + 4));
  if (*(int *)&search[1].dict + -0x300000 < -0x20000000) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
            ,0xc1,"Renormalizing Scores at frame %d, best score %d\n",(ulong)sas._4_4_,
            (ulong)*(uint *)&search[1].dict);
    renormalize_hmms((state_align_search_t *)search,sas._4_4_,*(int32 *)&search[1].dict);
  }
  iVar1 = evaluate_hmms((state_align_search_t *)search,senscr_00,sas._4_4_);
  *(int32 *)&search[1].dict = iVar1;
  prune_hmms((state_align_search_t *)search,sas._4_4_);
  phone_transition((state_align_search_t *)search,sas._4_4_);
  record_transitions((state_align_search_t *)search,sas._4_4_);
  *(uint *)((long)&search[1].acmod + 4) = sas._4_4_;
  return 0;
}

Assistant:

static int
state_align_search_step(ps_search_t *search, int frame_idx)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    acmod_t *acmod = ps_search_acmod(search);
    int16 const *senscr;
    int i;

    /* Calculate senone scores. */
    for (i = 0; i < sas->n_phones; ++i)
        if (hmm_frame(&sas->hmms[i]) == frame_idx)
            acmod_activate_hmm(acmod, &sas->hmms[i]);
    senscr = acmod_score(acmod, &frame_idx);

    /* Renormalize here if needed. */
    /* FIXME: Make sure to (unit-)test this!!! */
    if ((sas->best_score - 0x300000) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, sas->best_score);
        renormalize_hmms(sas, frame_idx, sas->best_score);
    }

    /* Viterbi step. */
    sas->best_score = evaluate_hmms(sas, senscr, frame_idx);
    prune_hmms(sas, frame_idx);

    /* Transition out of non-emitting states. */
    phone_transition(sas, frame_idx);

    /* Generate new tokens from best path results. */
    record_transitions(sas, frame_idx);

    /* Update frame counter */
    sas->frame = frame_idx;

    return 0;
}